

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O3

void __thiscall
fasttext::HierarchicalSoftmaxLoss::dfs
          (HierarchicalSoftmaxLoss *this,int32_t k,real threshold,int32_t node,real score,
          Predictions *heap,Vector *hidden)

{
  int32_t node_00;
  pointer pNVar1;
  element_type *peVar2;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  _Var3;
  pair<float,_int> __value;
  undefined1 auVar4 [16];
  pointer ppVar5;
  long lVar6;
  undefined1 auVar7 [16];
  float fVar8;
  double dVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  float local_54;
  pair<float,_int> local_38;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  auVar10._0_8_ = log((double)threshold + 1e-05);
  auVar10._8_56_ = extraout_var;
  auVar7._0_4_ = (float)auVar10._0_8_;
  auVar7._4_12_ = auVar10._4_12_;
  if (auVar7._0_4_ <= score) {
    local_54 = score;
    do {
      ppVar5 = (heap->
               super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if (((long)(heap->
                 super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar5 >> 3 == (long)k) &&
         (fVar8 = ppVar5->first, auVar7 = ZEXT416((uint)fVar8), local_54 < fVar8)) {
        return;
      }
      pNVar1 = (this->tree_).
               super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = (long)node;
      if ((pNVar1[lVar6].left == -1) && (pNVar1[lVar6].right == -1)) {
        local_38.second = node;
        local_38.first = local_54;
        std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>::
        emplace_back<std::pair<float,int>>
                  ((vector<std::pair<float,int>,std::allocator<std::pair<float,int>>> *)heap,
                   &local_38);
        ppVar5 = (heap->
                 super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
                 ._M_impl.super__Vector_impl_data._M_finish;
        _Var3._M_current =
             (heap->
             super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
        local_38 = (pair<float,_int>)comparePairs;
        std::
        __push_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,long,std::pair<float,int>,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>>
                  (_Var3,((long)ppVar5 - (long)_Var3._M_current >> 3) + -1,0,ppVar5[-1],
                   (_Iter_comp_val<bool_(*)(const_std::pair<float,_int>_&,_const_std::pair<float,_int>_&)>
                    *)&local_38);
        ppVar5 = (heap->
                 super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
                 ._M_impl.super__Vector_impl_data._M_finish;
        _Var3._M_current =
             (heap->
             super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)ppVar5 - (long)_Var3._M_current >> 3) <= (ulong)(long)k) {
          return;
        }
        if (8 < (long)ppVar5 - (long)_Var3._M_current) {
          __value = ppVar5[-1];
          ppVar5[-1].first = (_Var3._M_current)->first;
          ppVar5[-1].second = (_Var3._M_current)->second;
          std::
          __adjust_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,long,std::pair<float,int>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>>
                    (_Var3,0,(long)ppVar5 + (-8 - (long)_Var3._M_current) >> 3,__value,
                     (_Iter_comp_iter<bool_(*)(const_std::pair<float,_int>_&,_const_std::pair<float,_int>_&)>
                      )comparePairs);
          ppVar5 = (heap->
                   super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        }
        (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
        _M_impl.super__Vector_impl_data._M_finish = ppVar5 + -1;
        return;
      }
      peVar2 = (((this->super_BinaryLogisticLoss).super_Loss.wo_)->
               super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      (*peVar2->_vptr_Matrix[2])(peVar2,hidden,lVar6 - this->osz_);
      auVar4._8_4_ = 0x80000000;
      auVar4._0_8_ = 0x8000000080000000;
      auVar4._12_4_ = 0x80000000;
      auVar7 = vxorps_avx512vl(auVar7,auVar4);
      fVar8 = expf(auVar7._0_4_);
      node_00 = (this->tree_).
                super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar6].left;
      fVar8 = 1.0 / (fVar8 + 1.0);
      dVar9 = log((double)(1.0 - fVar8) + 1e-05);
      dfs(this,k,threshold,node_00,(float)dVar9 + local_54,heap,hidden);
      node = (this->tree_).
             super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar6].right;
      dVar9 = log((double)fVar8 + 1e-05);
      local_54 = local_54 + (float)dVar9;
      auVar11._0_8_ = log((double)threshold + 1e-05);
      auVar11._8_56_ = extraout_var_00;
      auVar7._0_4_ = (float)auVar11._0_8_;
      auVar7._4_12_ = auVar11._4_12_;
    } while (auVar7._0_4_ <= local_54);
  }
  return;
}

Assistant:

void HierarchicalSoftmaxLoss::dfs(
    int32_t k,
    real threshold,
    int32_t node,
    real score,
    Predictions& heap,
    const Vector& hidden) const {
  if (score < std_log(threshold)) {
    return;
  }
  if (heap.size() == k && score < heap.front().first) {
    return;
  }

  if (tree_[node].left == -1 && tree_[node].right == -1) {
    heap.push_back(std::make_pair(score, node));
    std::push_heap(heap.begin(), heap.end(), comparePairs);
    if (heap.size() > k) {
      std::pop_heap(heap.begin(), heap.end(), comparePairs);
      heap.pop_back();
    }
    return;
  }

  real f = wo_->dotRow(hidden, node - osz_);
  f = 1. / (1 + std::exp(-f));

  dfs(k, threshold, tree_[node].left, score + std_log(1.0 - f), heap, hidden);
  dfs(k, threshold, tree_[node].right, score + std_log(f), heap, hidden);
}